

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int js_parse_template(JSParseState *s,int call,int *argc)

{
  JSToken *token;
  anon_union_32_4_06729a41_for_u *paVar1;
  JSContext *ctx;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  int64_t extraout_RDX;
  int64_t extraout_RDX_00;
  JSRefCountHeader *p;
  uint32_t idx;
  uint8_t *p_00;
  JSValue v;
  JSValue JVar5;
  JSValue v_00;
  JSValue obj;
  JSValue JVar6;
  JSValue val;
  JSValueUnion local_98;
  JSValueUnion local_80;
  JSToken local_78;
  int *local_40;
  uint8_t *local_38;
  
  ctx = s->ctx;
  idx = 0;
  if (call != 0) {
    JVar6 = JS_NewArray(ctx);
    if ((int)JVar6.tag != 6) {
      iVar4 = emit_push_const(s,JVar6,0);
      JS_FreeValue(ctx,JVar6);
      if (((iVar4 == 0) && (_local_98 = JS_NewArray(ctx), local_98._8_4_ != 6)) &&
         (iVar4 = JS_DefinePropertyValue(ctx,JVar6,0x70,_local_98,0x4000), -1 < iVar4))
      goto LAB_0014c714;
    }
    return -1;
  }
  JVar6 = (JSValue)(ZEXT816(3) << 0x40);
  _local_98 = (JSValue)(ZEXT816(3) << 0x40);
LAB_0014c714:
  token = &s->token;
  local_40 = argc;
  do {
    local_80 = JVar6.u;
    if (token->val != -0x7e) {
      iVar4 = js_parse_expect(s,-0x7e);
      return iVar4;
    }
    p_00 = (s->token).ptr + 1;
    local_78.val = token->val;
    local_78.line_num = token->line_num;
    local_78.ptr = (s->token).ptr;
    local_78.u.str.str.u = (JSValueUnion)*(undefined8 *)&(s->token).u;
    local_78.u.str.str.tag = *(int64_t *)((long)&(s->token).u + 8);
    local_78.u.regexp.flags.u = (s->token).u.regexp.flags.u;
    local_78.u.regexp.flags.tag = (s->token).u.regexp.flags.tag;
    paVar1 = &(s->token).u;
    JVar5 = (paVar1->str).str;
    if (call == 0) {
      JS_FreeValue(ctx,(paVar1->str).str);
      (s->token).u.ident.atom = 0;
      (s->token).u.str.str.tag = 3;
      iVar4 = js_parse_string(s,0x60,1,p_00,&local_78,&local_38);
      uVar3 = local_78.u.str.str.tag;
      uVar2 = local_78.u.str.str.u;
      if (iVar4 != 0) {
        return -1;
      }
      if (((*(uint *)((long)local_78.u.str.str.u + 4) & 0x7fffffff) == 0) && (idx != 0)) {
        v.tag = local_78.u.str.str.tag;
        v.u.ptr = (void *)local_78.u.str.str.u;
        JS_FreeValue(s->ctx,v);
      }
      else {
        JVar5.tag = local_78.u.str.str.tag;
        JVar5.u.ptr = (void *)local_78.u.str.str.u;
        iVar4 = emit_push_const(s,JVar5,1);
        v_00.tag = uVar3;
        v_00.u.ptr = (void *)uVar2;
        JS_FreeValue(s->ctx,v_00);
        if (iVar4 != 0) {
          return -1;
        }
        if (idx == 0) {
          if ((s->token).u.str.sep == 0x60) goto LAB_0014c9ae;
          emit_op(s,'B');
          emit_u32(s,0x5c);
        }
        idx = idx + 1;
      }
      if ((s->token).u.str.sep == 0x60) {
        emit_op(s,'$');
        emit_u16(s,(short)idx - 1);
        goto LAB_0014c9ae;
      }
    }
    else {
      if (0xfffffff4 < (uint)(s->token).u.str.str.tag) {
        **(int **)paVar1 = **(int **)paVar1 + 1;
      }
      iVar4 = JS_DefinePropertyValueUint32(ctx,_local_98,idx,JVar5,0x4004);
      if (iVar4 < 0) {
        return -1;
      }
      iVar4 = js_parse_string(s,0x60,0,p_00,&local_78,&local_38);
      if (iVar4 != 0) {
        local_78.u.str.str.u = (JSValueUnion)((ulong)local_78.u.str.str.u & 0xffffffff00000000);
        local_78.u.str.str.tag = 3;
      }
      val.tag = local_78.u.str.str.tag;
      val.u.ptr = (void *)local_78.u.str.str.u;
      iVar4 = JS_DefinePropertyValueUint32(ctx,JVar6,idx,val,0x4004);
      if (iVar4 < 0) {
        return -1;
      }
      if ((s->token).u.str.sep == 0x60) {
        JVar6.tag = extraout_RDX;
        JVar6.u.float64 = local_98.float64;
        seal_template_obj(ctx,JVar6);
        obj.tag = extraout_RDX_00;
        obj.u.float64 = local_80.float64;
        seal_template_obj(ctx,obj);
        *local_40 = idx + 1;
LAB_0014c9ae:
        iVar4 = next_token(s);
        return iVar4;
      }
    }
    iVar4 = next_token(s);
    if (iVar4 != 0) {
      return -1;
    }
    iVar4 = js_parse_expr(s);
    if (iVar4 != 0) {
      return -1;
    }
    if (token->val != 0x7d) {
      js_parse_error(s,"expected \'}\' after template expression");
      return -1;
    }
    free_token(s,token);
    s->got_lf = 0;
    s->last_line_num = (s->token).line_num;
    iVar4 = js_parse_template_part(s,s->buf_ptr);
    if (iVar4 != 0) {
      return -1;
    }
    idx = idx + 1;
  } while( true );
}

Assistant:

static __exception int js_parse_template(JSParseState *s, int call, int *argc)
{
    JSContext *ctx = s->ctx;
    JSValue raw_array, template_object;
    JSToken cooked;
    int depth, ret;

    raw_array = JS_UNDEFINED; /* avoid warning */
    template_object = JS_UNDEFINED; /* avoid warning */
    if (call) {
        /* Create a template object: an array of cooked strings */
        /* Create an array of raw strings and store it to the raw property */
        template_object = JS_NewArray(ctx);
        if (JS_IsException(template_object))
            return -1;
        //        pool_idx = s->cur_func->cpool_count;
        ret = emit_push_const(s, template_object, 0);
        JS_FreeValue(ctx, template_object);
        if (ret)
            return -1;
        raw_array = JS_NewArray(ctx);
        if (JS_IsException(raw_array))
            return -1;
        if (JS_DefinePropertyValue(ctx, template_object, JS_ATOM_raw,
                                   raw_array, JS_PROP_THROW) < 0) {
            return -1;
        }
    }

    depth = 0;
    while (s->token.val == TOK_TEMPLATE) {
        const uint8_t *p = s->token.ptr + 1;
        cooked = s->token;
        if (call) {
            if (JS_DefinePropertyValueUint32(ctx, raw_array, depth,
                                             JS_DupValue(ctx, s->token.u.str.str),
                                             JS_PROP_ENUMERABLE | JS_PROP_THROW) < 0) {
                return -1;
            }
            /* re-parse the string with escape sequences but do not throw a
               syntax error if it contains invalid sequences
             */
            if (js_parse_string(s, '`', FALSE, p, &cooked, &p)) {
                cooked.u.str.str = JS_UNDEFINED;
            }
            if (JS_DefinePropertyValueUint32(ctx, template_object, depth,
                                             cooked.u.str.str,
                                             JS_PROP_ENUMERABLE | JS_PROP_THROW) < 0) {
                return -1;
            }
        } else {
            JSString *str;
            /* re-parse the string with escape sequences and throw a
               syntax error if it contains invalid sequences
             */
            JS_FreeValue(ctx, s->token.u.str.str);
            s->token.u.str.str = JS_UNDEFINED;
            if (js_parse_string(s, '`', TRUE, p, &cooked, &p))
                return -1;
            str = JS_VALUE_GET_STRING(cooked.u.str.str);
            if (str->len != 0 || depth == 0) {
                ret = emit_push_const(s, cooked.u.str.str, 1);
                JS_FreeValue(s->ctx, cooked.u.str.str);
                if (ret)
                    return -1;
                if (depth == 0) {
                    if (s->token.u.str.sep == '`')
                        goto done1;
                    emit_op(s, OP_get_field2);
                    emit_atom(s, JS_ATOM_concat);
                }
                depth++;
            } else {
                JS_FreeValue(s->ctx, cooked.u.str.str);
            }
        }
        if (s->token.u.str.sep == '`')
            goto done;
        if (next_token(s))
            return -1;
        if (js_parse_expr(s))
            return -1;
        depth++;
        if (s->token.val != '}') {
            return js_parse_error(s, "expected '}' after template expression");
        }
        /* XXX: should convert to string at this stage? */
        free_token(s, &s->token);
        /* Resume TOK_TEMPLATE parsing (s->token.line_num and
         * s->token.ptr are OK) */
        s->got_lf = FALSE;
        s->last_line_num = s->token.line_num;
        if (js_parse_template_part(s, s->buf_ptr))
            return -1;
    }
    return js_parse_expect(s, TOK_TEMPLATE);

 done:
    if (call) {
        /* Seal the objects */
        seal_template_obj(ctx, raw_array);
        seal_template_obj(ctx, template_object);
        *argc = depth + 1;
    } else {
        emit_op(s, OP_call_method);
        emit_u16(s, depth - 1);
    }
 done1:
    return next_token(s);
}